

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.cpp
# Opt level: O3

void __thiscall rw::World::addLight(World *this,Light *light)

{
  long lVar1;
  LLLink *pLVar2;
  byte bVar3;
  long lVar4;
  long lVar5;
  LLLink *pLVar6;
  void *pvVar7;
  long lVar8;
  
  light->world = this;
  pLVar2 = &light->inWorld;
  if (-1 < (char)(light->object).object.subType) {
    (light->inWorld).next = &(this->globalLights).link;
    pLVar6 = (this->globalLights).link.prev;
    (light->inWorld).prev = pLVar6;
    pLVar6->next = pLVar2;
    (this->globalLights).link.prev = pLVar2;
    return;
  }
  (light->inWorld).next = &(this->localLights).link;
  pLVar6 = (this->localLights).link.prev;
  (light->inWorld).prev = pLVar6;
  pLVar6->next = pLVar2;
  (this->localLights).link.prev = pLVar2;
  lVar8 = engine;
  pvVar7 = (light->object).object.parent;
  if (pvVar7 == (void *)0x0) {
    return;
  }
  lVar4 = *(long *)((long)pvVar7 + 0xc0);
  bVar3 = *(byte *)(lVar4 + 3);
  if ((bVar3 & 3) == 0) {
    lVar1 = engine + 0x10;
    lVar5 = *(long *)(engine + 0x10);
    *(long *)(lVar4 + 0x10) = lVar5;
    *(long *)(lVar4 + 0x18) = lVar1;
    *(long *)(lVar5 + 8) = lVar4 + 0x10;
    *(long *)(lVar8 + 0x10) = lVar4 + 0x10;
  }
  *(byte *)(lVar4 + 3) = bVar3 | 3;
  *(byte *)((long)pvVar7 + 3) = *(byte *)((long)pvVar7 + 3) | 0xc;
  return;
}

Assistant:

void
World::addLight(Light *light)
{
	assert(light->world == nil);
	light->world = this;
	if(light->getType() < Light::POINT){
		this->globalLights.append(&light->inWorld);
	}else{
		this->localLights.append(&light->inWorld);
		if(light->getFrame())
			light->getFrame()->updateObjects();
	}
}